

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O0

string * istr_abi_cxx11_(string *__return_storage_ptr__,int b)

{
  string local_38;
  allocator<char> local_16;
  undefined1 local_15;
  int local_14;
  string *psStack_10;
  int b_local;
  string *result;
  
  local_15 = 0;
  local_14 = b;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_16);
  std::allocator<char>::~allocator(&local_16);
  if (local_14 == -0x80000000) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"-inf");
  }
  else if (local_14 == 0x7fffffff) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"+inf");
  }
  else {
    std::__cxx11::to_string(&local_38,local_14);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string istr(int b) {
  std::string result = "";
  if (b == minf) {
    result = "-inf";
  } else if (b == pinf) {
    result = "+inf"; 
  } else {
    result = std::to_string(b);
  }
  return result;
}